

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int do_open(int ac,char **av)

{
  char *__s;
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  anon_class_8_1_3fcf6528 local_470;
  ProgressCallbackType local_468;
  anon_class_8_1_3fcf6528 local_448;
  MessageCallback local_440;
  undefined1 local_420 [8];
  cmake cm;
  allocator<char> local_81;
  string local_80;
  string local_60;
  int local_40;
  int local_3c;
  int i;
  Doing doing;
  string dir;
  char **av_local;
  int ac_local;
  
  dir.field_2._8_8_ = av;
  std::__cxx11::string::string((string *)&i);
  local_3c = 1;
  for (local_40 = 2; local_40 < ac; local_40 = local_40 + 1) {
    if (local_3c == 1) {
      __s = *(char **)(dir.field_2._8_8_ + (long)local_40 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
      cmsys::SystemTools::CollapseFullPath(&local_60,&local_80);
      std::__cxx11::string::operator=((string *)&i,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      local_3c = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
      poVar2 = std::operator<<(poVar2,*(char **)(dir.field_2._8_8_ + (long)local_40 * 8));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::clear();
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmake::cmake((cmake *)local_420,RoleInternal,Unknown);
    local_448.cm = (cmake *)local_420;
    std::function<void(std::__cxx11::string_const&,char_const*)>::
    function<do_open(int,char_const*const*)::__0,void>
              ((function<void(std::__cxx11::string_const&,char_const*)> *)&local_440,&local_448);
    cmSystemTools::SetMessageCallback(&local_440);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
    ::~function(&local_440);
    local_470.cm = (cmake *)local_420;
    std::function<void(std::__cxx11::string_const&,float)>::
    function<do_open(int,char_const*const*)::__1,void>
              ((function<void(std::__cxx11::string_const&,float)> *)&local_468,&local_470);
    cmake::SetProgressCallback((cmake *)local_420,&local_468);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
    ::~function(&local_468);
    bVar1 = cmake::Open((cmake *)local_420,(string *)&i,false);
    av_local._4_4_ = (uint)!bVar1;
    cm.MessageLogLevel = LOG_ERROR;
    cmake::~cmake((cmake *)local_420);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Usage: cmake --open <dir>\n");
    av_local._4_4_ = 1;
    cm.MessageLogLevel = LOG_ERROR;
  }
  std::__cxx11::string::~string((string *)&i);
  return av_local._4_4_;
}

Assistant:

static int do_open(int ac, char const* const* av)
{
#ifndef CMAKE_BUILD_WITH_CMAKE
  std::cerr << "This cmake does not support --open\n";
  return -1;
#else
  std::string dir;

  enum Doing
  {
    DoingNone,
    DoingDir,
  };
  Doing doing = DoingDir;
  for (int i = 2; i < ac; ++i) {
    switch (doing) {
      case DoingDir:
        dir = cmSystemTools::CollapseFullPath(av[i]);
        doing = DoingNone;
        break;
      default:
        std::cerr << "Unknown argument " << av[i] << std::endl;
        dir.clear();
        break;
    }
  }
  if (dir.empty()) {
    std::cerr << "Usage: cmake --open <dir>\n";
    return 1;
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cmSystemTools::SetMessageCallback(
    [&cm](const std::string& msg, const char* title) {
      cmakemainMessageCallback(msg, title, &cm);
    });
  cm.SetProgressCallback([&cm](const std::string& msg, float prog) {
    cmakemainProgressCallback(msg, prog, &cm);
  });
  return cm.Open(dir, false) ? 0 : 1;
#endif
}